

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_unary(JSParseState *s,int parse_flags)

{
  uint uVar1;
  JSAtom atom;
  JSFunctionDef *pJVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  byte bVar7;
  long lVar8;
  uint8_t val;
  char *pcVar9;
  JSValue val_00;
  int opcode;
  JSAtom name;
  int label;
  int scope;
  
  uVar1 = (s->token).val;
  if ((int)uVar1 < -0x28) {
    if (-0x4d < (int)uVar1) {
      if (uVar1 != 0xffffffb4) {
        if (uVar1 == 0xffffffb5) {
          iVar5 = next_token(s);
          if ((iVar5 == 0) && (iVar5 = js_parse_unary(s,0x10), iVar5 == 0)) {
            pJVar2 = s->cur_func;
            lVar8 = (long)pJVar2->last_opcode_pos;
            if ((-1 < lVar8) && ((pJVar2->byte_code).buf[lVar8] == 0xb6)) {
              (pJVar2->byte_code).buf[lVar8] = 0xb5;
            }
            emit_op(s,0x97);
            parse_flags = 0;
            bVar4 = true;
          }
          else {
            bVar4 = false;
          }
          if (!bVar4) {
            return -1;
          }
          goto LAB_0015f182;
        }
LAB_0015ee9a:
        iVar5 = js_parse_postfix_expr(s,parse_flags & 4U | 2);
        if (iVar5 != 0) {
          return -1;
        }
        if ((s->got_lf == 0) && (uVar1 = (s->token).val, (uVar1 & 0xfffffffe) == 0xffffff94)) {
          iVar5 = get_lvalue(s,&opcode,&scope,&name,&label,(int *)0x0,1,uVar1);
          if (iVar5 != 0) {
            return -1;
          }
          emit_op(s,(char)uVar1 + 0xfc);
          put_lvalue(s,opcode,scope,name,label,PUT_LVALUE_KEEP_SECOND,0);
          iVar5 = next_token(s);
          if (iVar5 != 0) {
            return -1;
          }
        }
        goto LAB_0015f182;
      }
      goto LAB_0015edcb;
    }
    if (uVar1 + 0x6c < 2) {
      iVar5 = next_token(s);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = js_parse_unary(s,0);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = get_lvalue(s,&opcode,&scope,&name,&label,(int *)0x0,1,uVar1);
      if (iVar5 != 0) {
        return -1;
      }
      emit_op(s,(char)uVar1 + 0xfa);
      put_lvalue(s,opcode,scope,name,label,PUT_LVALUE_KEEP_TOP,0);
      goto LAB_0015f182;
    }
    if (uVar1 != 0xffffffb3) goto LAB_0015ee9a;
    pJVar2 = s->cur_func;
    iVar5 = next_token(s);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = js_parse_unary(s,0x10);
    if (iVar5 != 0) {
      return -1;
    }
    sVar6 = (size_t)pJVar2->last_opcode_pos;
    if ((long)sVar6 < 0) {
      bVar7 = 0;
    }
    else {
      bVar7 = (pJVar2->byte_code).buf[sVar6];
    }
    if (bVar7 < 0x4a) {
      if (bVar7 == 0x41) {
        atom = *(JSAtom *)((pJVar2->byte_code).buf + sVar6 + 1);
        (pJVar2->byte_code).size = sVar6;
        pJVar2->last_opcode_pos = -1;
        val_00 = __JS_AtomToValue(s->ctx,atom,0);
        iVar5 = emit_push_const(s,val_00,1);
        JS_FreeValue(s->ctx,val_00);
        JS_FreeAtom(s->ctx,atom);
        if (iVar5 != 0) {
          return -1;
        }
      }
      else {
        if (bVar7 != 0x47) goto LAB_0015f0f9;
        (pJVar2->byte_code).size = sVar6;
        pJVar2->last_opcode_pos = -1;
      }
      val = 0x98;
      goto LAB_0015f17a;
    }
    if (bVar7 != 0x4a) {
      if (bVar7 == 0xb6) {
        puVar3 = (pJVar2->byte_code).buf;
        iVar5 = *(int *)(puVar3 + sVar6 + 1);
        if ((iVar5 != 8) && (iVar5 != 0x71)) {
          if ((pJVar2->js_mode & 1) != 0) {
            pcVar9 = "cannot delete a direct reference in strict mode";
            goto LAB_0015f067;
          }
          puVar3[sVar6] = 0xb8;
          goto LAB_0015f17f;
        }
      }
      else if (bVar7 == 0xbc) {
        pcVar9 = "cannot delete a private class field";
LAB_0015f067:
        js_parse_error(s,pcVar9);
        return -1;
      }
LAB_0015f0f9:
      emit_op(s,'\x0e');
      val = '\n';
      goto LAB_0015f17a;
    }
    emit_op(s,'0');
    opcode = 0;
    dbuf_put(&s->cur_func->byte_code,(uint8_t *)&opcode,4);
    dbuf_putc(&s->cur_func->byte_code,'\x03');
  }
  else {
    if ((uVar1 < 0x2e) && ((0x280200000000U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
LAB_0015edcb:
      iVar5 = next_token(s);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = js_parse_unary(s,0x10);
      if (iVar5 != 0) {
        return -1;
      }
      if ((int)uVar1 < 0x2b) {
        if (uVar1 == 0xffffffb4) {
          emit_op(s,'\x0e');
          val = '\x06';
        }
        else {
          if (uVar1 != 0x21) {
LAB_0015f20f:
            abort();
          }
          val = 0x96;
        }
      }
      else if (uVar1 == 0x2b) {
        val = 0x8d;
      }
      else if (uVar1 == 0x7e) {
        val = 0x95;
      }
      else {
        if (uVar1 != 0x2d) goto LAB_0015f20f;
        val = 0x8c;
      }
    }
    else {
      if (uVar1 != 0xffffffd8) {
        if (uVar1 != 0x7e) goto LAB_0015ee9a;
        goto LAB_0015edcb;
      }
      if ((s->cur_func->field_0x84 & 2) == 0) {
        pcVar9 = "unexpected \'await\' keyword";
LAB_0015efb7:
        js_parse_error(s,pcVar9);
        return -1;
      }
      if (s->cur_func->in_function_body == 0) {
        pcVar9 = "await in default expression";
        goto LAB_0015efb7;
      }
      iVar5 = next_token(s);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = js_parse_unary(s,0x10);
      if (iVar5 != 0) {
        return -1;
      }
      val = 0x8b;
    }
LAB_0015f17a:
    emit_op(s,val);
  }
LAB_0015f17f:
  parse_flags = 0;
LAB_0015f182:
  if ((parse_flags & 0x18U) == 0) {
    return 0;
  }
  if ((s->token).val != -0x5d) {
    return 0;
  }
  if ((parse_flags & 0x10U) != 0) {
    JS_ThrowSyntaxError(s->ctx,
                        "unparenthesized unary expression can\'t appear on the left-hand side of \'**\'"
                       );
    return -1;
  }
  iVar5 = next_token(s);
  if (iVar5 == 0) {
    iVar5 = js_parse_unary(s,8);
    if (iVar5 == 0) {
      emit_op(s,0x9f);
      return 0;
    }
    return -1;
  }
  return -1;
}

Assistant:

static __exception int js_parse_unary(JSParseState *s, int parse_flags)
{
    int op;

    switch(s->token.val) {
    case '+':
    case '-':
    case '!':
    case '~':
    case TOK_VOID:
        op = s->token.val;
        if (next_token(s))
            return -1;
        if (js_parse_unary(s, PF_POW_FORBIDDEN))
            return -1;
        switch(op) {
        case '-':
            emit_op(s, OP_neg);
            break;
        case '+':
            emit_op(s, OP_plus);
            break;
        case '!':
            emit_op(s, OP_lnot);
            break;
        case '~':
            emit_op(s, OP_not);
            break;
        case TOK_VOID:
            emit_op(s, OP_drop);
            emit_op(s, OP_undefined);
            break;
        default:
            abort();
        }
        parse_flags = 0;
        break;
    case TOK_DEC:
    case TOK_INC:
        {
            int opcode, op, scope, label;
            JSAtom name;
            op = s->token.val;
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, 0))
                return -1;
            if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, TRUE, op))
                return -1;
            emit_op(s, OP_dec + op - TOK_DEC);
            put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_TOP,
                       FALSE);
        }
        break;
    case TOK_TYPEOF:
        {
            JSFunctionDef *fd;
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_FORBIDDEN))
                return -1;
            /* reference access should not return an exception, so we
               patch the get_var */
            fd = s->cur_func;
            if (get_prev_opcode(fd) == OP_scope_get_var) {
                fd->byte_code.buf[fd->last_opcode_pos] = OP_scope_get_var_undef;
            }
            emit_op(s, OP_typeof);
            parse_flags = 0;
        }
        break;
    case TOK_DELETE:
        if (js_parse_delete(s))
            return -1;
        parse_flags = 0;
        break;
    case TOK_AWAIT:
        if (!(s->cur_func->func_kind & JS_FUNC_ASYNC))
            return js_parse_error(s, "unexpected 'await' keyword");
        if (!s->cur_func->in_function_body)
            return js_parse_error(s, "await in default expression");
        if (next_token(s))
            return -1;
        if (js_parse_unary(s, PF_POW_FORBIDDEN))
            return -1;
        emit_op(s, OP_await);
        parse_flags = 0;
        break;
    default:
        if (js_parse_postfix_expr(s, (parse_flags & PF_ARROW_FUNC) |
                                  PF_POSTFIX_CALL))
            return -1;
        if (!s->got_lf &&
            (s->token.val == TOK_DEC || s->token.val == TOK_INC)) {
            int opcode, op, scope, label;
            JSAtom name;
            op = s->token.val;
            if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, TRUE, op))
                return -1;
            emit_op(s, OP_post_dec + op - TOK_DEC);
            put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_SECOND,
                       FALSE);
            if (next_token(s))
                return -1;        
        }
        break;
    }
    if (parse_flags & (PF_POW_ALLOWED | PF_POW_FORBIDDEN)) {
#ifdef CONFIG_BIGNUM
        if (s->token.val == TOK_POW || s->token.val == TOK_MATH_POW) {
            /* Extended exponentiation syntax rules: we extend the ES7
               grammar in order to have more intuitive semantics:
               -2**2 evaluates to -4. */
            if (!(s->cur_func->js_mode & JS_MODE_MATH)) {
                if (parse_flags & PF_POW_FORBIDDEN) {
                    JS_ThrowSyntaxError(s->ctx, "unparenthesized unary expression can't appear on the left-hand side of '**'");
                    return -1;
                }
            }
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_ALLOWED))
                return -1;
            emit_op(s, OP_pow);
        }
#else
        if (s->token.val == TOK_POW) {
            /* Strict ES7 exponentiation syntax rules: To solve
               conficting semantics between different implementations
               regarding the precedence of prefix operators and the
               postifx exponential, ES7 specifies that -2**2 is a
               syntax error. */
            if (parse_flags & PF_POW_FORBIDDEN) {
                JS_ThrowSyntaxError(s->ctx, "unparenthesized unary expression can't appear on the left-hand side of '**'");
                return -1;
            }
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_ALLOWED))
                return -1;
            emit_op(s, OP_pow);
        }
#endif
    }
    return 0;
}